

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.h
# Opt level: O3

void __thiscall FIntermissionActionCast::FIntermissionActionCast(FIntermissionActionCast *this)

{
  (this->super_FIntermissionAction).mMusic.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mBackground.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mPalette.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mSound.Chars = FString::NullString.Nothing;
  (this->super_FIntermissionAction).mOverlays.Array = (FIntermissionPatch *)0x0;
  (this->super_FIntermissionAction).mOverlays.Most = 0;
  (this->super_FIntermissionAction).mOverlays.Count = 0;
  (this->super_FIntermissionAction).mFlatfill = false;
  (this->super_FIntermissionAction).mMusicLooping = true;
  (this->super_FIntermissionAction).mMusicOrder = 0;
  (this->super_FIntermissionAction).mCdTrack = 0;
  (this->super_FIntermissionAction).mCdId = 0;
  (this->super_FIntermissionAction).mDuration = 0;
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionActionCast_006ec988;
  (this->mName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 5;
  (this->mCastClass).Index = 0;
  (this->mCastSounds).Array = (FCastSound *)0x0;
  (this->mCastSounds).Most = 0;
  (this->mCastSounds).Count = 0;
  (this->super_FIntermissionAction).mSize = 0x80;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenCast::RegistrationInfo.MyClass;
  return;
}

Assistant:

FString () : Chars(&NullString.Nothing[0]) { NullString.RefCount++; }